

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O1

SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
::operator-=(SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
             *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *vec)

{
  uint *puVar1;
  int iVar2;
  int *piVar3;
  pointer pnVar4;
  long lVar5;
  undefined1 local_58 [16];
  pointer local_48;
  uint auStack_40 [2];
  uint local_38 [2];
  int local_30;
  bool local_2c;
  undefined8 local_28;
  
  if (vec->setupStatus == true) {
    lVar5 = (long)(vec->super_IdxSet).num;
    if (0 < lVar5) {
      lVar5 = lVar5 + 1;
      do {
        piVar3 = (vec->super_IdxSet).idx;
        pnVar4 = (vec->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar2 = piVar3[lVar5 + -2];
        local_38 = *(uint (*) [2])((long)&pnVar4[iVar2].m_backend.data + 0x20);
        local_58._0_8_ = *(undefined8 *)&pnVar4[iVar2].m_backend.data;
        local_58._8_8_ = *(undefined8 *)((long)&pnVar4[iVar2].m_backend.data + 8);
        puVar1 = (uint *)((long)&pnVar4[iVar2].m_backend.data + 0x10);
        local_48 = *(pointer *)puVar1;
        auStack_40 = *(uint (*) [2])(puVar1 + 2);
        local_30 = pnVar4[iVar2].m_backend.exp;
        local_2c = pnVar4[iVar2].m_backend.neg;
        local_28._0_4_ = pnVar4[iVar2].m_backend.fpclass;
        local_28._4_4_ = pnVar4[iVar2].m_backend.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  ((cpp_dec_float<50U,_int,_void> *)
                   ((long)piVar3[lVar5 + -2] * 0x38 + *(long *)(this + 0x20)),
                   (cpp_dec_float<50U,_int,_void> *)local_58);
        lVar5 = lVar5 + -1;
      } while (1 < lVar5);
    }
  }
  else {
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ::vector((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              *)local_58,
             &(vec->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::operator-=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  *)(this + 0x20),
                 (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)local_58);
    if ((pointer)local_58._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_58._0_8_,(long)local_48 - local_58._0_8_);
    }
  }
  if (this[0x38] ==
      (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
       )0x1) {
    this[0x38] = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  )0x0;
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)this);
  }
  return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
}

Assistant:

SSVectorBase<R>& operator-=(const SSVectorBase<S>& vec)
   {
      if(vec.isSetup())
      {
         for(int i = vec.size() - 1; i >= 0; --i)
            VectorBase<R>::val[vec.index(i)] -= vec.value(i);
      }
      else
         VectorBase<R>::operator-=(VectorBase<S>(vec));

      if(isSetup())
      {
         setupStatus = false;
         setup();
      }

      return *this;
   }